

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O3

string * num_to_roman_abi_cxx11_(string *__return_storage_ptr__,uint32_t num)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  pointer puVar3;
  string *psVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  uint32_t *puVar9;
  uint32_t *puVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  pointer puVar14;
  double dVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  ostringstream oss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  string *local_1d0;
  string local_1c8;
  long *local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  long local_198 [12];
  ios_base local_138 [264];
  int iVar8;
  
  cVar6 = '\x01';
  if (9 < num) {
    uVar12 = (ulong)num;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      uVar7 = (uint)uVar12;
      if (uVar7 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001073bf;
      }
      if (uVar7 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001073bf;
      }
      if (uVar7 < 10000) goto LAB_001073bf;
      uVar12 = uVar12 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (99999 < uVar7);
    cVar6 = cVar6 + '\x01';
  }
LAB_001073bf:
  local_1d0 = __return_storage_ptr__;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,local_1a0,num);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (CONCAT44(uStack_19c,local_1a0) != 0) {
    lVar11 = 0;
    iVar13 = 0;
    do {
      lVar11 = lVar11 + 1;
      dVar15 = pow(10.0,(double)(int)lVar11);
      iVar8 = (int)((ulong)num % ((long)dVar15 & 0xffffffffU));
      uVar7 = iVar8 - iVar13;
      local_1a8 = (long *)CONCAT44(local_1a8._4_4_,uVar7);
      if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_1e8,
                   (iterator)
                   local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)&local_1a8);
      }
      else {
        *local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar7;
        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar13 = iVar8;
    } while (CONCAT44(uStack_19c,local_1a0) != lVar11);
    puVar10 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start < puVar10 &&
        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar9 = puVar2 + 1;
        uVar1 = *puVar2;
        *puVar2 = *puVar10;
        *puVar10 = uVar1;
        puVar10 = puVar10 + -1;
        puVar2 = puVar9;
      } while (puVar9 < puVar10);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  puVar3 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar14 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (*puVar14 != 0) {
        val_to_rnum_abi_cxx11_(&local_1c8,*puVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar3);
  }
  psVar4 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return psVar4;
}

Assistant:

std::string num_to_roman(uint32_t num)
{
	auto size = std::to_string(num).size();
	std::vector<uint32_t> nums;
	uint32_t prev{ 0 };
	for (int i = 0; i != size; ++i)
	{
		auto div = static_cast<uint32_t>(std::pow(10, (i + 1)));
		auto curr = num % div;
		nums.push_back(curr - prev);
		prev = curr;
	}
	std::reverse(nums.begin(), nums.end());
	std::ostringstream oss;
	for (auto& n : nums)
	{
		if (n != 0)
		{
			oss << val_to_rnum(n);
		}
	}
	return oss.str();
}